

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int usage(int argc,char **argv)

{
  ostream *poVar1;
  undefined8 *in_RSI;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,(char *)*in_RSI);
  poVar1 = std::operator<<(poVar1," file.(pic|bup|txa|msk) file.png OPTIONS");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "    Converts Switch and PS3 Higurashi picture file file.pic to PNG file.png"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Options:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "    -replace replacement.png: Convert the given png to a file of the same type as the input and write it to the output"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "    -debug-images debugImagesFolder: Write individual chunks to the given folder for debugging"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "    -bup-parts: Output separately combinable parts instead of precombined images when decoding bup files"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

int usage(int argc, const char **argv) {
	std::cerr << "Usage: " << argv[0] << " file.(pic|bup|txa|msk) file.png OPTIONS" << std::endl;
	std::cerr << "    Converts Switch and PS3 Higurashi picture file file.pic to PNG file.png" << std::endl;
	std::cerr << "Options:" << std::endl;
	std::cerr << "    -replace replacement.png: Convert the given png to a file of the same type as the input and write it to the output" << std::endl;
	std::cerr << "    -debug-images debugImagesFolder: Write individual chunks to the given folder for debugging" << std::endl;
	std::cerr << "    -bup-parts: Output separately combinable parts instead of precombined images when decoding bup files" << std::endl;
	exit(1);
}